

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_rw_hook_set(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  undefined1 *puVar1;
  char cVar2;
  undefined1 uVar3;
  long lVar4;
  undefined8 uVar5;
  code *pcVar6;
  fio_data_s *pfVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  fio_lock_i ret;
  timespec local_48;
  void *local_38;
  
  iVar8 = fio_is_closed(uuid);
  iVar9 = -1;
  if (iVar8 == 0) {
    if (rw_hooks->read == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
      rw_hooks->read = fio_hooks_default_read;
    }
    if (rw_hooks->write == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
      rw_hooks->write = fio_hooks_default_write;
    }
    if (rw_hooks->flush == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
      rw_hooks->flush = fio_hooks_default_flush;
    }
    if (rw_hooks->before_close == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
      rw_hooks->before_close = fio_hooks_default_before_close;
    }
    if (rw_hooks->cleanup == (_func_void_void_ptr *)0x0) {
      rw_hooks->cleanup = fio_hooks_default_cleanup;
    }
    pfVar7 = fio_data;
    iVar9 = (int)((ulong)uuid >> 8);
    lVar11 = (long)iVar9 * 0xa8;
    LOCK();
    pcVar10 = (char *)((long)fio_data + lVar11 + 0x6e);
    cVar2 = *pcVar10;
    *pcVar10 = '\x01';
    UNLOCK();
    local_38 = udata;
    if (cVar2 != '\0') {
      pcVar10 = (char *)((long)pfVar7 + lVar11 + 0x6e);
      do {
        local_48.tv_sec = 0;
        local_48.tv_nsec = 1;
        nanosleep(&local_48,(timespec *)0x0);
        LOCK();
        cVar2 = *pcVar10;
        *pcVar10 = '\x01';
        UNLOCK();
      } while (cVar2 != '\0');
    }
    pfVar7 = fio_data;
    if (CONCAT41(iVar9,*(undefined1 *)((long)fio_data + lVar11 + 0x6d)) == uuid) {
      lVar4 = *(long *)((long)fio_data + lVar11 + 0xa8);
      uVar5 = *(undefined8 *)((long)fio_data + lVar11 + 0xb0);
      *(fio_rw_hook_s **)((long)fio_data + lVar11 + 0xa8) = rw_hooks;
      *(void **)((long)pfVar7 + lVar11 + 0xb0) = local_38;
      LOCK();
      puVar1 = (undefined1 *)((long)pfVar7 + lVar11 + 0x6e);
      uVar3 = *puVar1;
      *puVar1 = 0;
      UNLOCK();
      local_48.tv_sec = CONCAT71(local_48.tv_sec._1_7_,uVar3);
      iVar9 = 0;
      if ((lVar4 != 0) && (pcVar6 = *(code **)(lVar4 + 0x20), pcVar6 != (code *)0x0)) {
        (*pcVar6)(uVar5);
        iVar9 = 0;
      }
    }
    else {
      LOCK();
      *(undefined1 *)((long)fio_data + lVar11 + 0x6e) = 0;
      UNLOCK();
      iVar9 = -1;
    }
  }
  return iVar9;
}

Assistant:

int fio_rw_hook_set(intptr_t uuid, fio_rw_hook_s *rw_hooks, void *udata) {
  if (fio_is_closed(uuid))
    goto invalid_uuid;
  if (!rw_hooks->read)
    rw_hooks->read = fio_hooks_default_read;
  if (!rw_hooks->write)
    rw_hooks->write = fio_hooks_default_write;
  if (!rw_hooks->flush)
    rw_hooks->flush = fio_hooks_default_flush;
  if (!rw_hooks->before_close)
    rw_hooks->before_close = fio_hooks_default_before_close;
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  intptr_t fd = fio_uuid2fd(uuid);
  fio_rw_hook_s *old_rw_hooks;
  void *old_udata;
  fio_lock(&fd_data(fd).sock_lock);
  if (fd2uuid(fd) != uuid) {
    fio_unlock(&fd_data(fd).sock_lock);
    goto invalid_uuid;
  }
  old_rw_hooks = fd_data(fd).rw_hooks;
  old_udata = fd_data(fd).rw_udata;
  fd_data(fd).rw_hooks = rw_hooks;
  fd_data(fd).rw_udata = udata;
  fio_unlock(&fd_data(fd).sock_lock);
  if (old_rw_hooks && old_rw_hooks->cleanup)
    old_rw_hooks->cleanup(old_udata);
  return 0;
invalid_uuid:
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup(udata);
  return -1;
}